

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

int __thiscall PFloat::GetLoadOp(PFloat *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24;
  iVar2 = 0x11;
  if (iVar1 != 4) {
    if (iVar1 != 8) {
      __assert_fail("Size == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x59b,"virtual int PFloat::GetLoadOp() const");
    }
    iVar2 = 0x13;
  }
  return iVar2;
}

Assistant:

int PFloat::GetLoadOp() const
{
	if (Size == 4)
	{
		return OP_LSP;
	}
	else
	{
		assert(Size == 8);
		return OP_LDP;
	}
	assert(0 && "Cannot load this type");
	return OP_NOP;
}